

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.c
# Opt level: O0

int libssh2_session_last_error(LIBSSH2_SESSION *session,char **errmsg,int *errmsg_len,int want_buf)

{
  char *pcVar1;
  char *local_48;
  char *error;
  size_t msglen;
  int want_buf_local;
  int *errmsg_len_local;
  char **errmsg_local;
  LIBSSH2_SESSION *session_local;
  
  error = (char *)0x0;
  if (session->err_code == 0) {
    if (errmsg != (char **)0x0) {
      if (want_buf == 0) {
        *errmsg = "";
      }
      else {
        pcVar1 = (char *)(*session->alloc)(1,&session->abstract);
        *errmsg = pcVar1;
        if (*errmsg != (char *)0x0) {
          **errmsg = '\0';
        }
      }
    }
    if (errmsg_len != (int *)0x0) {
      *errmsg_len = 0;
    }
    session_local._4_4_ = 0;
  }
  else {
    if (errmsg != (char **)0x0) {
      if (session->err_msg == (char *)0x0) {
        local_48 = "";
      }
      else {
        local_48 = session->err_msg;
      }
      error = (char *)strlen(local_48);
      if (want_buf == 0) {
        *errmsg = local_48;
      }
      else {
        pcVar1 = (char *)(*session->alloc)((size_t)(error + 1),&session->abstract);
        *errmsg = pcVar1;
        if (*errmsg != (char *)0x0) {
          memcpy(*errmsg,local_48,(size_t)error);
          (*errmsg)[(long)error] = '\0';
        }
      }
    }
    if (errmsg_len != (int *)0x0) {
      *errmsg_len = (int)error;
    }
    session_local._4_4_ = session->err_code;
  }
  return session_local._4_4_;
}

Assistant:

LIBSSH2_API int
libssh2_session_last_error(LIBSSH2_SESSION * session, char **errmsg,
                           int *errmsg_len, int want_buf)
{
    size_t msglen = 0;

    /* No error to report */
    if(!session->err_code) {
        if(errmsg) {
            if(want_buf) {
                *errmsg = LIBSSH2_ALLOC(session, 1);
                if(*errmsg) {
                    **errmsg = 0;
                }
            }
            else {
                *errmsg = (char *) "";
            }
        }
        if(errmsg_len) {
            *errmsg_len = 0;
        }
        return 0;
    }

    if(errmsg) {
        const char *error = session->err_msg ? session->err_msg : "";

        msglen = strlen(error);

        if(want_buf) {
            /* Make a copy so the calling program can own it */
            *errmsg = LIBSSH2_ALLOC(session, msglen + 1);
            if(*errmsg) {
                memcpy(*errmsg, error, msglen);
                (*errmsg)[msglen] = 0;
            }
        }
        else
            *errmsg = (char *)error;
    }

    if(errmsg_len) {
        *errmsg_len = (int)msglen;
    }

    return session->err_code;
}